

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csr.c
# Opt level: O0

int csrMain(int argc,char **argv)

{
  int iVar1;
  err_t code_00;
  char *pcVar2;
  long in_RSI;
  int in_EDI;
  err_t code;
  char **in_stack_00000028;
  int in_stack_00000030;
  uint in_stack_ffffffffffffffe8;
  undefined4 in_stack_ffffffffffffffec;
  int local_4;
  
  if (in_EDI < 2) {
    local_4 = csrUsage();
  }
  else {
    pcVar2 = (char *)(in_RSI + 8);
    iVar1 = strCmp(pcVar2,(char *)CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8));
    if (iVar1 == 0) {
      code_00 = csrRewrap(in_stack_00000030,in_stack_00000028);
    }
    else {
      iVar1 = strCmp(pcVar2,(char *)CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8));
      if (iVar1 == 0) {
        code_00 = csrVal(argc,argv);
      }
      else {
        code_00 = 0x259;
      }
    }
    if ((code_00 != 0) ||
       (iVar1 = strCmp(pcVar2,(char *)(ulong)in_stack_ffffffffffffffe8), iVar1 == 0)) {
      pcVar2 = errMsg(code_00);
      printf("bee2cmd/%s: %s\n","csr",pcVar2);
    }
    local_4 = 0;
    if (code_00 != 0) {
      local_4 = -1;
    }
  }
  return local_4;
}

Assistant:

int csrMain(int argc, char* argv[])
{
	err_t code;
	// справка
	if (argc < 2)
		return csrUsage();
	// разбор команды
	++argv, --argc;
	if (strEq(argv[0], "rewrap"))
		code = csrRewrap(argc - 1, argv + 1);
	else if (strEq(argv[0], "val"))
		code = csrVal(argc - 1, argv + 1);
	else
		code = ERR_CMD_NOT_FOUND;
	// завершить
	if (code != ERR_OK || strEq(argv[0], "val"))
		printf("bee2cmd/%s: %s\n", _name, errMsg(code));
	return code != ERR_OK ? -1 : 0;
}